

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QDBusArgument qvariant_cast<QDBusArgument>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QDBusArgument *pQVar4;
  QMetaType QVar5;
  void *pvVar6;
  QDBusArgumentPrivate *in_RDI;
  long in_FS_OFFSET;
  QDBusArgument *t;
  QMetaType targetType;
  QMetaType *in_stack_ffffffffffffffa8;
  QDBusArgumentPrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar3 = QMetaType::fromType<QDBusArgument>();
  QVariant::Private::type((Private *)this);
  bVar2 = operator==((QMetaType *)this,in_stack_ffffffffffffffa8);
  if (bVar2) {
    pQVar4 = QVariant::Private::get<QDBusArgument>((Private *)0x1131f1);
    QDBusArgument::QDBusArgument((QDBusArgument *)this,(QDBusArgument *)pQVar4);
  }
  else {
    *(undefined8 *)this = 0xaaaaaaaaaaaaaaaa;
    QDBusArgument::QDBusArgument((QDBusArgument *)this);
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pvVar6 = QVariant::constData((QVariant *)0x113232);
    QMetaType::convert(QVar5,pvVar6,QVar3,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDBusArgument)in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}